

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::timerEvent(QMainWindowLayout *this,QTimerEvent *e)

{
  if (*(int *)(e + 0x10) == *(int *)(this + 0x778)) {
    QBasicTimer::stop();
    std::__uniq_ptr_impl<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_>::
    reset((__uniq_ptr_impl<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_> *)
          (this + 0x6f8),(pointer)0x0);
  }
  QObject::timerEvent((QTimerEvent *)this);
  return;
}

Assistant:

void QMainWindowLayout::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == discardRestoredStateTimer.timerId()) {
        discardRestoredStateTimer.stop();
        restoredState.reset();
    }
    QLayout::timerEvent(e);
}